

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

VariablePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VariablePortHeaderSyntax,slang::syntax::VariablePortHeaderSyntax_const&>
          (BumpAllocator *this,VariablePortHeaderSyntax *args)

{
  undefined4 uVar1;
  VariablePortHeaderSyntax *pVVar2;
  long lVar3;
  VariablePortHeaderSyntax *pVVar4;
  byte bVar5;
  
  bVar5 = 0;
  pVVar2 = (VariablePortHeaderSyntax *)allocate(this,0x50,8);
  pVVar4 = pVVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_PortHeaderSyntax).super_SyntaxNode.field_0x4;
    (pVVar4->super_PortHeaderSyntax).super_SyntaxNode.kind =
         (args->super_PortHeaderSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pVVar4->super_PortHeaderSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (VariablePortHeaderSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pVVar4 = (VariablePortHeaderSyntax *)((long)pVVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pVVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }